

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O1

void __thiscall Heap<Astar<Tiles>::Node>::push(Heap<Astar<Tiles>::Node> *this,Node *n)

{
  pointer pMVar1;
  uint uVar2;
  
  uVar2 = (uint)n->f;
  pMVar1 = (this->qs).
           super__Vector_base<Heap<Astar<Tiles>::Node>::Maxq,_std::allocator<Heap<Astar<Tiles>::Node>::Maxq>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)uVar2 <
      (ulong)((long)(this->qs).
                    super__Vector_base<Heap<Astar<Tiles>::Node>::Maxq,_std::allocator<Heap<Astar<Tiles>::Node>::Maxq>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1 >> 5)) {
    if ((int)uVar2 < this->min) {
      this->min = uVar2;
    }
    Maxq::push(pMVar1 + (int)uVar2,n,(int)n->g);
    this->fill = this->fill + 1;
    return;
  }
  __assert_fail("(unsigned int) p0 < qs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/shunjilin[P]15PuzzleExternalMemorySearch/src/heap.hpp"
                ,0x4c,
                "void Heap<Astar<Tiles>::Node>::push(HeapElm *) [HeapElm = Astar<Tiles>::Node]");
}

Assistant:

void push(HeapElm *n) {
		int p0 = n->f;
 
		assert ((unsigned int) p0 < qs.size());

		if (p0 < min)
			min = p0;

		qs[p0].push(n, n->g);
		fill++;
	}